

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

_Bool player_can_fire(player *p,_Bool show_msg)

{
  object *poVar1;
  bool bVar2;
  
  poVar1 = equipped_item_by_slot_name(p,"shooting");
  if (poVar1 == (object *)0x0) {
    if (!show_msg) {
      return false;
    }
  }
  else {
    bVar2 = (p->state).ammo_tval != L'\0';
    if (!show_msg || bVar2) {
      return bVar2;
    }
  }
  msg("You have nothing to fire with.");
  return false;
}

Assistant:

bool player_can_fire(struct player *p, bool show_msg)
{
	struct object *obj = equipped_item_by_slot_name(p, "shooting");

	/* Require a usable launcher */
	if (!obj || !p->state.ammo_tval) {
		if (show_msg)
			msg("You have nothing to fire with.");
		return false;
	}

	return true;
}